

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::SignWithKey
          (TransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,bool has_grind_r,ByteData256 *aux_rand,ByteData *annex)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  SigHashType *in_R8;
  byte in_R9B;
  UtxoData utxo;
  uint in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  string *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  SigHashType local_59c [12];
  UtxoData *in_stack_fffffffffffffa70;
  UtxoData *in_stack_fffffffffffffa78;
  OutPoint *in_stack_fffffffffffffa80;
  TransactionContext *in_stack_fffffffffffffa88;
  allocator local_551;
  string local_550 [8];
  ByteData *in_stack_fffffffffffffab8;
  ByteData256 *in_stack_fffffffffffffac0;
  SigHashType *in_stack_fffffffffffffac8;
  Privkey *in_stack_fffffffffffffad0;
  OutPoint *in_stack_fffffffffffffad8;
  TransactionContext *in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffb37;
  Amount *in_stack_fffffffffffffb38;
  SigHashType *in_stack_fffffffffffffb40;
  Privkey *in_stack_fffffffffffffb48;
  pointer in_stack_fffffffffffffb50;
  OutPoint *in_stack_fffffffffffffb58;
  TransactionContext *in_stack_fffffffffffffb60;
  AddressType in_stack_fffffffffffffb70;
  UtxoData *in_stack_fffffffffffffc28;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  UtxoData::UtxoData(in_stack_fffffffffffffa70);
  bVar1 = IsFindUtxoMap(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                        in_stack_fffffffffffffa78);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"Utxo is not found. sign fail.",&local_551);
    core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               error_code,in_stack_fffffffffffffa20);
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  GetLockingScriptFromUtxoData(in_stack_fffffffffffffc28);
  cfd::core::Script::operator=
            ((Script *)&stack0xfffffffffffffb30,(Script *)&stack0xfffffffffffffa70);
  core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  bVar2 = cfd::core::Script::IsTaprootScript();
  if ((bVar2 & 1) == 0) {
    cfd::core::SigHashType::SigHashType(local_59c,in_R8);
    in_stack_fffffffffffffa10 = (uint)(in_R9B & 1);
    SignWithPrivkeySimple
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (Pubkey *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb70,
               (bool)in_stack_fffffffffffffb37);
  }
  else {
    SignWithSchnorrPrivkeySimple
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  }
  UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  return;
}

Assistant:

void TransactionContext::SignWithKey(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, bool has_grind_r, const ByteData256* aux_rand,
    const ByteData* annex) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. sign fail.");
  }
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    SignWithSchnorrPrivkeySimple(
        outpoint, privkey, sighash_type, aux_rand, annex);
  } else {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.amount,
        utxo.address_type, has_grind_r);
  }
}